

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitIteratorCatchAndFinally
               (ByteCodeLabel catchLabel,ByteCodeLabel finallyLabel,RegSlot iteratorLocation,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,RegSlot yieldExceptionLocation,
               RegSlot yieldOffsetLocation,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
               bool isAsync)

{
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  EmitIteratorTopLevelCatch
            (catchLabel,iteratorLocation,shouldCallReturnFunctionLocation,
             shouldCallReturnFunctionLocationFinally,byteCodeGenerator,funcInfo,isAsync);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  EmitIteratorTopLevelFinally
            (finallyLabel,iteratorLocation,shouldCallReturnFunctionLocationFinally,
             yieldExceptionLocation,yieldOffsetLocation,byteCodeGenerator,funcInfo,isAsync);
  FuncInfo::ReleaseTmpRegister(funcInfo,shouldCallReturnFunctionLocationFinally);
  FuncInfo::ReleaseTmpRegister(funcInfo,shouldCallReturnFunctionLocation);
  return;
}

Assistant:

void EmitIteratorCatchAndFinally(
    Js::ByteCodeLabel catchLabel,
    Js::ByteCodeLabel finallyLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    Js::RegSlot yieldExceptionLocation,
    Js::RegSlot yieldOffsetLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync = false)
{
    byteCodeGenerator->PopJumpCleanup();

    EmitIteratorTopLevelCatch(
        catchLabel,
        iteratorLocation,
        shouldCallReturnFunctionLocation,
        shouldCallReturnFunctionLocationFinally,
        byteCodeGenerator,
        funcInfo,
        isAsync);

    byteCodeGenerator->PopJumpCleanup();

    EmitIteratorTopLevelFinally(
        finallyLabel,
        iteratorLocation,
        shouldCallReturnFunctionLocationFinally,
        yieldExceptionLocation,
        yieldOffsetLocation,
        byteCodeGenerator,
        funcInfo,
        isAsync);

    funcInfo->ReleaseTmpRegister(shouldCallReturnFunctionLocationFinally);
    funcInfo->ReleaseTmpRegister(shouldCallReturnFunctionLocation);
}